

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# element_position_bitmask_table.hpp
# Opt level: O2

void __thiscall
burst::algorithm::detail::element_position_bitmask_table<std::array<std::bitset<32ul>,256ul>>::
initialize<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
          (element_position_bitmask_table<std::array<std::bitset<32ul>,256ul>> *this,
          __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          first,__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                last)

{
  ulong uVar1;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var2;
  
  uVar1 = 1;
  for (_Var2._M_current = first._M_current; _Var2._M_current != last._M_current;
      _Var2._M_current = _Var2._M_current + 1) {
    *(ulong *)(this + (ulong)(byte)*_Var2._M_current * 8) =
         *(ulong *)(this + (ulong)(byte)*_Var2._M_current * 8) | uVar1;
    uVar1 = (ulong)(uint)((int)uVar1 * 2);
  }
  *(long *)(this + 0x800) = (long)last._M_current - (long)first._M_current;
  return;
}

Assistant:

void initialize (InputIterator first, InputIterator last)
                {
                    using iterated_type = iterator_value_t<InputIterator>;
                    static_assert
                    (
                        std::is_integral<iterated_type>::value && sizeof(iterated_type) == 1,
                        "Входной элемент должен быть однобайтовым целым числом."
                    );

                    auto elements_count = std::size_t{0};

                    auto position_indicator = bitmask_type{0b1};
                    while (first != last)
                    {
                        m_bitmasks[static_cast<unsigned char>(*first)] |= position_indicator;

                        ++first;
                        position_indicator = left_shift(position_indicator, 1u);
                        ++elements_count;
                    }

                    m_sequence_length = elements_count;
                }